

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O1

void Tim_ManCreateBox(Tim_Man_t *p,int firstIn,int nIns,int firstOut,int nOuts,int iDelayTable,
                     int fBlack)

{
  uint uVar1;
  uint uVar2;
  Tim_Obj_t *pTVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  if (p->vBoxes == (Vec_Ptr_t *)0x0) {
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    pVVar4->pArray = ppvVar5;
    p->vBoxes = pVVar4;
  }
  puVar6 = (uint *)Mem_FlexEntryFetch(p->pMemObj,(nOuts + nIns) * 4 + 0x1c);
  puVar6[0] = 0;
  puVar6[1] = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  puVar6[3] = 0;
  puVar6[4] = 0;
  puVar6[5] = 0;
  puVar6[6] = 0;
  pVVar4 = p->vBoxes;
  uVar1 = pVVar4->nSize;
  *puVar6 = uVar1;
  uVar2 = pVVar4->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar5;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar2 * 2;
      if (iVar7 <= (int)uVar2) goto LAB_00470a2d;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
      pVVar4->pArray = ppvVar5;
    }
    pVVar4->nCap = iVar7;
  }
LAB_00470a2d:
  iVar7 = pVVar4->nSize;
  pVVar4->nSize = iVar7 + 1;
  pVVar4->pArray[iVar7] = puVar6;
  puVar6[4] = iDelayTable;
  puVar6[2] = nIns;
  puVar6[3] = nOuts;
  puVar6[6] = fBlack;
  if (0 < nIns) {
    lVar8 = (long)firstIn * 0x18;
    uVar9 = 0;
    do {
      if ((long)p->nCos <= (long)((long)firstIn + uVar9)) {
        __assert_fail("firstIn+i < p->nCos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/tim/timBox.c"
                      ,0x3c,"void Tim_ManCreateBox(Tim_Man_t *, int, int, int, int, int, int)");
      }
      puVar6[uVar9 + 7] = firstIn + (int)uVar9;
      pTVar3 = p->pCos;
      *(uint *)((long)&pTVar3->iObj2Box + lVar8) = *puVar6;
      *(int *)((long)&pTVar3->iObj2Num + lVar8) = (int)uVar9;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while ((uint)nIns != uVar9);
  }
  if (0 < nOuts) {
    lVar8 = (long)firstOut * 0x18;
    uVar9 = 0;
    do {
      if ((long)p->nCis <= (long)((long)firstOut + uVar9)) {
        __assert_fail("firstOut+i < p->nCis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/tim/timBox.c"
                      ,0x43,"void Tim_ManCreateBox(Tim_Man_t *, int, int, int, int, int, int)");
      }
      puVar6[(long)nIns + uVar9 + 7] = firstOut + (int)uVar9;
      pTVar3 = p->pCis;
      *(uint *)((long)&pTVar3->iObj2Box + lVar8) = *puVar6;
      *(int *)((long)&pTVar3->iObj2Num + lVar8) = (int)uVar9;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while ((uint)nOuts != uVar9);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the new timing box.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Tim_ManCreateBox( Tim_Man_t * p, int firstIn, int nIns, int firstOut, int nOuts, int iDelayTable, int fBlack )
{
    Tim_Box_t * pBox;
    int i;
    if ( p->vBoxes == NULL )
        p->vBoxes = Vec_PtrAlloc( 100 );
    pBox = (Tim_Box_t *)Mem_FlexEntryFetch( p->pMemObj, sizeof(Tim_Box_t) + sizeof(int) * (nIns+nOuts) );
    memset( pBox, 0, sizeof(Tim_Box_t) );
    pBox->iBox = Vec_PtrSize( p->vBoxes );
    Vec_PtrPush( p->vBoxes, pBox );
    pBox->iDelayTable = iDelayTable;
    pBox->nInputs  = nIns;
    pBox->nOutputs = nOuts;
    pBox->fBlack = fBlack;
    for ( i = 0; i < nIns; i++ )
    {
        assert( firstIn+i < p->nCos );
        pBox->Inouts[i] = firstIn+i;
        p->pCos[firstIn+i].iObj2Box = pBox->iBox;
        p->pCos[firstIn+i].iObj2Num = i;
    }
    for ( i = 0; i < nOuts; i++ )
    {
        assert( firstOut+i < p->nCis );
        pBox->Inouts[nIns+i] = firstOut+i;
        p->pCis[firstOut+i].iObj2Box = pBox->iBox;
        p->pCis[firstOut+i].iObj2Num = i;
    }
//    if ( pBox->iBox < 20 )
//        printf( "%4d  %4d  %4d  %4d  \n", firstIn, nIns, firstOut, nOuts );
}